

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O3

string * __thiscall cmMakefile::GetIncludeRegularExpression_abi_cxx11_(cmMakefile *this)

{
  string *psVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"INCLUDE_REGULAR_EXPRESSION","");
  psVar1 = (string *)GetProperty(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (psVar1 == (string *)0x0) {
    psVar1 = &cmValue::Empty_abi_cxx11_;
  }
  return psVar1;
}

Assistant:

const std::string& GetIncludeRegularExpression() const
  {
    return this->GetProperty("INCLUDE_REGULAR_EXPRESSION");
  }